

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memchr.c
# Opt level: O0

void * memchr(void *__s,int __c,size_t __n)

{
  byte *local_30;
  uchar *p;
  size_t n_local;
  int c_local;
  void *s_local;
  
  local_30 = (byte *)__s;
  p = (uchar *)__n;
  while( true ) {
    if (p == (uchar *)0x0) {
      return (void *)0x0;
    }
    if ((uint)*local_30 == (__c & 0xffU)) break;
    local_30 = local_30 + 1;
    p = p + -1;
  }
  return local_30;
}

Assistant:

void * memchr( const void * s, int c, size_t n )
{
    const unsigned char * p = ( const unsigned char * ) s;

    while ( n-- )
    {
        if ( *p == ( unsigned char ) c )
        {
            return ( void * ) p;
        }

        ++p;
    }

    return NULL;
}